

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall
H264StreamReader::getIdrPrevFrames(H264StreamReader *this,uint8_t *buff,uint8_t *bufEnd)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  SPSUnit *pSVar4;
  undefined1 local_b8 [4];
  int MaxPicOrderCntLsbHalf;
  SliceUnit slice;
  uint8_t *nal;
  int deserializeRez;
  int prevPicCnt;
  uint8_t *bufEnd_local;
  uint8_t *buff_local;
  H264StreamReader *this_local;
  
  nal._4_4_ = 0;
  slice.sps = (SPSUnit *)
              NALUnit::findNextNAL
                        (buff + 4,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd
                        );
  do {
    if ((SPSUnit *)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd <= slice.sps)
    {
      if (((this->super_MPEGStreamReader).m_eof & 1U) == 0) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = nal._4_4_;
      }
      return this_local._4_4_;
    }
    SliceUnit::SliceUnit((SliceUnit *)local_b8);
    uVar2 = *(byte *)&((slice.sps)->super_NALUnit)._vptr_NALUnit & 0x1f;
    if ((4 < uVar2 - 1) && (uVar2 != 0x14)) goto LAB_0029cef6;
    iVar3 = deserializeSliceHeader(this,(SliceUnit *)local_b8,(uint8_t *)slice.sps,bufEnd);
    if ((iVar3 == -10) && (((this->super_MPEGStreamReader).m_eof & 1U) == 0)) {
      this_local._4_4_ = -1;
      bVar1 = true;
    }
    else if (iVar3 == 0) {
      bVar1 = SliceUnit::isIDR((SliceUnit *)local_b8);
      if ((bVar1) && (slice.non_idr_flag == 0)) {
        this_local._4_4_ = 0;
        bVar1 = true;
      }
      else {
        if (slice.non_idr_flag == 0) {
          pSVar4 = SliceUnit::getSPS((SliceUnit *)local_b8);
          if ((int)(uint)slice.frame_num <=
              1 << ((char)pSVar4->log2_max_pic_order_cnt_lsb - 1U & 0x1f)) {
            this_local._4_4_ = nal._4_4_;
            bVar1 = true;
            goto LAB_0029cf00;
          }
          if (slice.pic_parameter_set_id == 0) {
            nal._4_4_ = nal._4_4_ + 1;
          }
        }
LAB_0029cef6:
        bVar1 = false;
      }
    }
    else {
      this_local._4_4_ = 0;
      bVar1 = true;
    }
LAB_0029cf00:
    SliceUnit::~SliceUnit((SliceUnit *)local_b8);
    if (bVar1) {
      return this_local._4_4_;
    }
    slice.sps = (SPSUnit *)
                NALUnit::findNextNAL
                          ((uint8_t *)slice.sps,
                           (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  } while( true );
}

Assistant:

int H264StreamReader::getIdrPrevFrames(uint8_t *buff, const uint8_t *bufEnd)
{
    int prevPicCnt = 0;
    int deserializeRez;
    for (uint8_t *nal = NALUnit::findNextNAL(buff + 4, m_bufEnd); nal < m_bufEnd;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
    {
        SliceUnit slice;

        int MaxPicOrderCntLsbHalf;
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            deserializeRez = deserializeSliceHeader(slice, nal, bufEnd);
            if (deserializeRez == NOT_ENOUGH_BUFFER && !m_eof)
                return -1;
            if (deserializeRez != 0)
                return 0;
            if (slice.isIDR() && slice.first_mb_in_slice == 0)
                return 0;
            if (slice.first_mb_in_slice != 0)
                break;
            MaxPicOrderCntLsbHalf = 1 << (slice.getSPS()->log2_max_pic_order_cnt_lsb - 1);
            if (slice.pic_order_cnt_lsb > MaxPicOrderCntLsbHalf)
            {
                if (slice.bottom_field_flag == 0)
                    prevPicCnt++;
            }
            else
                return prevPicCnt;
            break;
        default:
            break;
        }
    }
    if (m_eof)
        return prevPicCnt;
    return -1;
}